

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_monster_flags(parser *p)

{
  _Bool _Var1;
  errr eVar2;
  void *pvVar3;
  char *pcVar4;
  char *str;
  char *local_30;
  char *s;
  char *flags;
  monster_race *r;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    _Var1 = parser_hasval(p,"flags");
    if (_Var1) {
      pcVar4 = parser_getstr(p,"flags");
      pcVar4 = string_make(pcVar4);
      local_30 = strtok(pcVar4," |");
      while (local_30 != (char *)0x0) {
        eVar2 = grab_flag((bitflag *)((long)pvVar3 + 0x5c),0xc,r_info_flags,local_30);
        if (eVar2 != 0) {
          str = format("bad monster race flag: %s",local_30);
          plog(str);
          string_free(pcVar4);
          return PARSE_ERROR_INVALID_FLAG;
        }
        local_30 = strtok((char *)0x0," |");
      }
      string_free(pcVar4);
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    else {
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_monster_flags(struct parser *p) {
	struct monster_race *r = parser_priv(p);
	char *flags;
	char *s;

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	if (!parser_hasval(p, "flags"))
		return PARSE_ERROR_NONE;
	flags = string_make(parser_getstr(p, "flags"));
	s = strtok(flags, " |");
	while (s) {
		if (grab_flag(r->flags, RF_SIZE, r_info_flags, s)) {
			plog(format("bad monster race flag: %s", s));
			string_free(flags);
			return PARSE_ERROR_INVALID_FLAG;
		}
		s = strtok(NULL, " |");
	}

	string_free(flags);
	return PARSE_ERROR_NONE;
}